

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cc
# Opt level: O1

void __thiscall
brotli::BlockSplitter<brotli::Histogram<704>_>::FinishBlock
          (BlockSplitter<brotli::Histogram<704>_> *this,bool is_final)

{
  uint *puVar1;
  uint uVar2;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *pvVar3;
  size_t sVar4;
  BlockSplit *pBVar5;
  pointer puVar6;
  pointer puVar7;
  size_t sVar8;
  uint32_t *puVar9;
  ulong uVar10;
  size_t i;
  long lVar11;
  uint *puVar12;
  ulong uVar13;
  uint *__dest;
  pointer pHVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined4 uVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double diff [2];
  double combined_entropy [2];
  Histogram<704> combined_histo [2];
  double local_1688 [6];
  uint local_1658 [704];
  long local_b58 [2];
  undefined1 local_b48 [2840];
  
  if (this->block_size_ < this->min_block_size_) {
    this->block_size_ = this->min_block_size_;
  }
  if (this->num_blocks_ == 0) {
    pBVar5 = this->split_;
    *(pBVar5->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = (uint)this->block_size_;
    *(pBVar5->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = '\0';
    uVar16 = this->alphabet_size_;
    pHVar14 = (this->histograms_->
              super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    puVar9 = pHVar14->data_;
    dVar25 = 0.0;
    uVar13 = 0;
    if ((uVar16 & 1) != 0) goto LAB_00186c19;
    while (pHVar14 < (pointer)(puVar9 + uVar16)) {
      uVar10 = (ulong)pHVar14->data_[0];
      pHVar14 = (pointer)(pHVar14->data_ + 1);
      uVar13 = uVar13 + uVar10;
      if (uVar10 < 0x100) {
        dVar18 = (double)*(float *)(kLog2Table + uVar10 * 4);
      }
      else {
        dVar18 = log2((double)uVar10);
      }
      dVar25 = dVar25 - (double)uVar10 * dVar18;
LAB_00186c19:
      uVar10 = (ulong)pHVar14->data_[0];
      pHVar14 = (pointer)(pHVar14->data_ + 1);
      uVar13 = uVar13 + uVar10;
      if (uVar10 < 0x100) {
        dVar18 = (double)*(float *)(kLog2Table + uVar10 * 4);
      }
      else {
        dVar18 = log2((double)uVar10);
      }
      dVar25 = dVar25 - (double)uVar10 * dVar18;
    }
    uVar23 = (undefined4)(uVar13 >> 0x20);
    if (uVar13 != 0) {
      auVar20._8_4_ = uVar23;
      auVar20._0_8_ = uVar13;
      auVar20._12_4_ = 0x45300000;
      dVar18 = (auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
      if (uVar13 < 0x100) {
        dVar19 = (double)*(float *)(kLog2Table + uVar13 * 4);
      }
      else {
        dVar19 = log2(dVar18);
      }
      dVar25 = dVar25 + dVar18 * dVar19;
    }
    auVar26._8_4_ = uVar23;
    auVar26._0_8_ = uVar13;
    auVar26._12_4_ = 0x45300000;
    dVar18 = (auVar26._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
    if (dVar18 <= dVar25) {
      dVar18 = dVar25;
    }
    this->last_entropy_[0] = dVar18;
    this->last_entropy_[1] = dVar18;
    this->num_blocks_ = this->num_blocks_ + 1;
    this->split_->num_types = this->split_->num_types + 1;
    this->curr_histogram_ix_ = this->curr_histogram_ix_ + 1;
    this->block_size_ = 0;
  }
  else if (this->block_size_ != 0) {
    uVar16 = this->alphabet_size_;
    pHVar14 = (this->histograms_->
              super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>).
              _M_impl.super__Vector_impl_data._M_start + this->curr_histogram_ix_;
    puVar9 = pHVar14->data_;
    dVar25 = 0.0;
    uVar13 = 0;
    if ((uVar16 & 1) == 0) goto LAB_00186d2e;
    while( true ) {
      uVar10 = (ulong)pHVar14->data_[0];
      pHVar14 = (pointer)(pHVar14->data_ + 1);
      uVar13 = uVar13 + uVar10;
      if (uVar10 < 0x100) {
        dVar18 = (double)*(float *)(kLog2Table + uVar10 * 4);
      }
      else {
        dVar18 = log2((double)uVar10);
      }
      dVar25 = dVar25 - (double)uVar10 * dVar18;
LAB_00186d2e:
      if ((pointer)(puVar9 + uVar16) <= pHVar14) break;
      uVar10 = (ulong)pHVar14->data_[0];
      pHVar14 = (pointer)(pHVar14->data_ + 1);
      uVar13 = uVar13 + uVar10;
      if (uVar10 < 0x100) {
        dVar18 = (double)*(float *)(kLog2Table + uVar10 * 4);
      }
      else {
        dVar18 = log2((double)uVar10);
      }
      dVar25 = dVar25 - (double)uVar10 * dVar18;
    }
    uVar23 = (undefined4)(uVar13 >> 0x20);
    if (uVar13 != 0) {
      auVar21._8_4_ = uVar23;
      auVar21._0_8_ = uVar13;
      auVar21._12_4_ = 0x45300000;
      dVar18 = (auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
      if (uVar13 < 0x100) {
        dVar19 = (double)*(float *)(kLog2Table + uVar13 * 4);
      }
      else {
        dVar19 = log2(dVar18);
      }
      dVar25 = dVar25 + dVar18 * dVar19;
    }
    auVar27._8_4_ = uVar23;
    auVar27._0_8_ = uVar13;
    auVar27._12_4_ = 0x45300000;
    dVar18 = (auVar27._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
    lVar15 = 0;
    do {
      memset((void *)((long)local_1658 + lVar15),0,0xb08);
      *(undefined8 *)((long)local_b58 + lVar15 + 8) = 0x7ff0000000000000;
      lVar15 = lVar15 + 0xb10;
    } while (lVar15 != 0x1620);
    if (dVar18 <= dVar25) {
      dVar18 = dVar25;
    }
    puVar12 = local_1658;
    lVar15 = 0;
    do {
      pvVar3 = this->histograms_;
      __dest = local_1658 + lVar15 * 0x2c4;
      sVar4 = this->last_histogram_ix_[lVar15];
      memcpy(__dest,(pvVar3->
                    super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + this->curr_histogram_ix_,0xb10);
      pHVar14 = (pvVar3->
                super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_b58[lVar15 * 0x162] = local_b58[lVar15 * 0x162] + pHVar14[sVar4].total_count_;
      lVar11 = 0;
      do {
        puVar12[lVar11] = puVar12[lVar11] + pHVar14[sVar4].data_[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x2c0);
      puVar1 = __dest + this->alphabet_size_;
      dVar25 = 0.0;
      uVar16 = 0;
      if ((this->alphabet_size_ & 1) != 0) goto LAB_00186ff6;
      while (__dest < puVar1) {
        uVar13 = (ulong)*__dest;
        __dest = __dest + 1;
        uVar16 = uVar16 + uVar13;
        if (uVar13 < 0x100) {
          dVar19 = (double)*(float *)(kLog2Table + uVar13 * 4);
        }
        else {
          dVar19 = log2((double)uVar13);
        }
        dVar25 = dVar25 - (double)uVar13 * dVar19;
LAB_00186ff6:
        uVar13 = (ulong)*__dest;
        __dest = __dest + 1;
        uVar16 = uVar16 + uVar13;
        if (uVar13 < 0x100) {
          dVar19 = (double)*(float *)(kLog2Table + uVar13 * 4);
        }
        else {
          dVar19 = log2((double)uVar13);
        }
        dVar25 = dVar25 - (double)uVar13 * dVar19;
      }
      uVar23 = (undefined4)(uVar16 >> 0x20);
      if (uVar16 != 0) {
        auVar22._8_4_ = uVar23;
        auVar22._0_8_ = uVar16;
        auVar22._12_4_ = 0x45300000;
        dVar24 = auVar22._8_8_ - 1.9342813113834067e+25;
        dVar19 = dVar24 + ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
        if (uVar16 < 0x100) {
          dVar24 = (double)*(float *)(kLog2Table + uVar16 * 4);
        }
        else {
          local_1688[4] = dVar19;
          local_1688[5] = dVar24;
          dVar24 = log2(dVar19);
          dVar19 = local_1688[4];
        }
        dVar25 = dVar25 + dVar19 * dVar24;
      }
      auVar28._8_4_ = uVar23;
      auVar28._0_8_ = uVar16;
      auVar28._12_4_ = 0x45300000;
      dVar19 = (auVar28._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
      if (dVar19 <= dVar25) {
        dVar19 = dVar25;
      }
      local_1688[lVar15 + 2] = dVar19;
      local_1688[lVar15] = (dVar19 - dVar18) - this->last_entropy_[lVar15];
      puVar12 = puVar12 + 0x2c4;
      bVar17 = lVar15 == 0;
      lVar15 = lVar15 + 1;
    } while (bVar17);
    pBVar5 = this->split_;
    uVar16 = pBVar5->num_types;
    if (((0xff < uVar16) || (local_1688[0] <= this->split_threshold_)) ||
       (local_1688[1] <= this->split_threshold_)) {
      uVar2 = (uint)this->block_size_;
      sVar4 = this->num_blocks_;
      puVar6 = (pBVar5->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (local_1688[0] + -20.0 <= local_1688[1]) {
        puVar6 = puVar6 + (sVar4 - 1);
        *puVar6 = *puVar6 + uVar2;
        memcpy((this->histograms_->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start + this->last_histogram_ix_[0],local_1658,
               0xb10);
        this->last_entropy_[0] = local_1688[2];
        if (this->split_->num_types == 1) {
          this->last_entropy_[1] = local_1688[2];
        }
        this->block_size_ = 0;
        pHVar14 = (this->histograms_->
                  super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        sVar4 = this->curr_histogram_ix_;
        memset(pHVar14 + sVar4,0,0xb08);
        pHVar14[sVar4].bit_cost_ = INFINITY;
        uVar16 = this->merge_last_count_ + 1;
        this->merge_last_count_ = uVar16;
        if (1 < uVar16) {
          this->target_block_size_ = this->target_block_size_ + this->min_block_size_;
        }
      }
      else {
        puVar6[sVar4] = uVar2;
        puVar7 = (pBVar5->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar7[sVar4] = puVar7[sVar4 - 2];
        pvVar3 = this->histograms_;
        sVar4 = this->last_histogram_ix_[0];
        sVar8 = this->last_histogram_ix_[1];
        this->last_histogram_ix_[0] = sVar8;
        this->last_histogram_ix_[1] = sVar4;
        memcpy((pvVar3->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start + sVar8,local_b48,0xb10);
        this->last_entropy_[1] = this->last_entropy_[0];
        this->last_entropy_[0] = local_1688[3];
        this->num_blocks_ = this->num_blocks_ + 1;
        this->block_size_ = 0;
        pHVar14 = (this->histograms_->
                  super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        sVar4 = this->curr_histogram_ix_;
        memset(pHVar14 + sVar4,0,0xb08);
        pHVar14[sVar4].bit_cost_ = INFINITY;
        this->merge_last_count_ = 0;
        this->target_block_size_ = this->min_block_size_;
      }
    }
    else {
      sVar4 = this->num_blocks_;
      (pBVar5->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar4] = (uint)this->block_size_;
      (pBVar5->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[sVar4] = (uchar)uVar16;
      pBVar5 = this->split_;
      this->last_histogram_ix_[1] = this->last_histogram_ix_[0];
      this->last_histogram_ix_[0] = (ulong)(byte)pBVar5->num_types;
      this->last_entropy_[1] = this->last_entropy_[0];
      this->last_entropy_[0] = dVar18;
      this->num_blocks_ = this->num_blocks_ + 1;
      pBVar5->num_types = pBVar5->num_types + 1;
      this->curr_histogram_ix_ = this->curr_histogram_ix_ + 1;
      this->block_size_ = 0;
      this->merge_last_count_ = 0;
      this->target_block_size_ = this->min_block_size_;
    }
  }
  if (is_final) {
    std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::resize
              (this->histograms_,this->split_->num_types);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->split_->types,this->num_blocks_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->split_->lengths,this->num_blocks_);
  }
  return;
}

Assistant:

void FinishBlock(bool is_final) {
    if (block_size_ < min_block_size_) {
      block_size_ = min_block_size_;
    }
    if (num_blocks_ == 0) {
      // Create first block.
      split_->lengths[0] = static_cast<uint32_t>(block_size_);
      split_->types[0] = 0;
      last_entropy_[0] =
          BitsEntropy(&(*histograms_)[0].data_[0], alphabet_size_);
      last_entropy_[1] = last_entropy_[0];
      ++num_blocks_;
      ++split_->num_types;
      ++curr_histogram_ix_;
      block_size_ = 0;
    } else if (block_size_ > 0) {
      double entropy = BitsEntropy(&(*histograms_)[curr_histogram_ix_].data_[0],
                                   alphabet_size_);
      HistogramType combined_histo[2];
      double combined_entropy[2];
      double diff[2];
      for (size_t j = 0; j < 2; ++j) {
        size_t last_histogram_ix = last_histogram_ix_[j];
        combined_histo[j] = (*histograms_)[curr_histogram_ix_];
        combined_histo[j].AddHistogram((*histograms_)[last_histogram_ix]);
        combined_entropy[j] = BitsEntropy(
            &combined_histo[j].data_[0], alphabet_size_);
        diff[j] = combined_entropy[j] - entropy - last_entropy_[j];
      }

      if (split_->num_types < kMaxBlockTypes &&
          diff[0] > split_threshold_ &&
          diff[1] > split_threshold_) {
        // Create new block.
        split_->lengths[num_blocks_] = static_cast<uint32_t>(block_size_);
        split_->types[num_blocks_] = static_cast<uint8_t>(split_->num_types);
        last_histogram_ix_[1] = last_histogram_ix_[0];
        last_histogram_ix_[0] = static_cast<uint8_t>(split_->num_types);
        last_entropy_[1] = last_entropy_[0];
        last_entropy_[0] = entropy;
        ++num_blocks_;
        ++split_->num_types;
        ++curr_histogram_ix_;
        block_size_ = 0;
        merge_last_count_ = 0;
        target_block_size_ = min_block_size_;
      } else if (diff[1] < diff[0] - 20.0) {
        // Combine this block with second last block.
        split_->lengths[num_blocks_] = static_cast<uint32_t>(block_size_);
        split_->types[num_blocks_] = split_->types[num_blocks_ - 2];
        std::swap(last_histogram_ix_[0], last_histogram_ix_[1]);
        (*histograms_)[last_histogram_ix_[0]] = combined_histo[1];
        last_entropy_[1] = last_entropy_[0];
        last_entropy_[0] = combined_entropy[1];
        ++num_blocks_;
        block_size_ = 0;
        (*histograms_)[curr_histogram_ix_].Clear();
        merge_last_count_ = 0;
        target_block_size_ = min_block_size_;
      } else {
        // Combine this block with last block.
        split_->lengths[num_blocks_ - 1] += static_cast<uint32_t>(block_size_);
        (*histograms_)[last_histogram_ix_[0]] = combined_histo[0];
        last_entropy_[0] = combined_entropy[0];
        if (split_->num_types == 1) {
          last_entropy_[1] = last_entropy_[0];
        }
        block_size_ = 0;
        (*histograms_)[curr_histogram_ix_].Clear();
        if (++merge_last_count_ > 1) {
          target_block_size_ += min_block_size_;
        }
      }
    }
    if (is_final) {
      (*histograms_).resize(split_->num_types);
      split_->types.resize(num_blocks_);
      split_->lengths.resize(num_blocks_);
    }
  }